

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Array<const_kj::StringPtr> * __thiscall
kj::heapArray<kj::StringPtr_const,kj::StringPtr_const*>
          (Array<const_kj::StringPtr> *__return_storage_ptr__,kj *this,StringPtr *begin,
          StringPtr *end)

{
  StringPtr *__dest;
  Array<const_kj::StringPtr> *result;
  size_t __n;
  
  __dest = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,(long)begin - (long)this >> 4,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  __n = (long)begin - (long)this;
  if (__n != 0) {
    memcpy(__dest,this,__n);
  }
  __return_storage_ptr__->ptr = __dest;
  __return_storage_ptr__->size_ = (long)__n >> 4;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}